

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

clock_t __thiscall lest::times::times(times *this,tms *__buffer)

{
  options option;
  _Setfill<char> _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  timer *in_stack_00000010;
  ostream *in_stack_00000018;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  
  action::action(&this->super_action,(ostream *)__buffer);
  option.lexical = (bool)(char)in_stack_ffffffffffffff98;
  option.random = (bool)(char)((ulong)in_stack_ffffffffffffff98 >> 8);
  option.verbose = (bool)(char)((ulong)in_stack_ffffffffffffff98 >> 0x10);
  option.version = (bool)(char)((ulong)in_stack_ffffffffffffff98 >> 0x18);
  option.repeat = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  option.help = (bool)(char)in_stack_ffffffffffffff90;
  option.abort = (bool)(char)((ulong)in_stack_ffffffffffffff90 >> 8);
  option.count = (bool)(char)((ulong)in_stack_ffffffffffffff90 >> 0x10);
  option.list = (bool)(char)((ulong)in_stack_ffffffffffffff90 >> 0x18);
  option.tags = (bool)(char)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  option.time = (bool)(char)((ulong)in_stack_ffffffffffffff90 >> 0x28);
  option.pass = (bool)(char)((ulong)in_stack_ffffffffffffff90 >> 0x30);
  option.zen = (bool)(char)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  option.seed._0_7_ = in_stack_ffffffffffffffa0;
  option.seed._7_1_ = in_stack_ffffffffffffffa7;
  env::env((env *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_00000018,
           option);
  this->selected = 0;
  this->failures = 0;
  timer::timer(in_stack_00000010);
  poVar3 = (this->super_action).os;
  _Var1 = std::setfill<char>(' ');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
  _Var2 = std::setprecision(0);
  poVar3 = std::operator<<(poVar3,_Var2);
  return (clock_t)poVar3;
}

Assistant:

times( std::ostream & out, options option )
    : action( out ), output( out, option ), selected( 0 ), failures( 0 ), total()
    {
        os << std::setfill(' ') << std::fixed << std::setprecision( lest_FEATURE_TIME_PRECISION );
    }